

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O0

BOOL __thiscall Js::RecyclableObject::SkipsPrototype(RecyclableObject *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  Type *pTVar5;
  undefined4 *puVar6;
  RecyclableObject *this_local;
  
  iVar3 = (*(this->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x5c])();
  pTVar5 = GetType(this);
  BVar4 = Js::Type::SkipsPrototype(pTVar5);
  if (iVar3 != BVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                                ,0x101,
                                "(this->DbgSkipsPrototype() == this->GetType()->SkipsPrototype())",
                                "this->DbgSkipsPrototype() == this->GetType()->SkipsPrototype()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pTVar5 = GetType(this);
  BVar4 = Js::Type::SkipsPrototype(pTVar5);
  return BVar4;
}

Assistant:

BOOL RecyclableObject::SkipsPrototype() const
    {
        Assert(this->DbgSkipsPrototype() == this->GetType()->SkipsPrototype());
        return this->GetType()->SkipsPrototype();
    }